

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb__reg_parse(stb_matcher *matcher,int start,char *regex,stb_uint16 *end)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int i;
  int iVar5;
  stb_uint32 *__s;
  long lVar6;
  int iVar7;
  byte *pbVar8;
  uint from;
  uint from_00;
  uint uVar9;
  int iVar10;
  stb_uint16 last_end;
  int k [2];
  stb_uint8 flags [256];
  ushort local_14a;
  uint local_148 [2];
  stb_uint16 *local_140;
  byte local_138 [264];
  
  local_14a = (ushort)start;
  from = 0xffffffff;
  local_140 = end;
LAB_001927c2:
  uVar9 = (uint)local_14a;
  pbVar8 = (byte *)regex;
LAB_001927c8:
  regex = (char *)(pbVar8 + 1);
  bVar1 = *pbVar8;
  if (0x3e < bVar1) {
    if (bVar1 < 0x5b) {
      if (bVar1 == 0x3f) goto code_r0x00192842;
    }
    else if (bVar1 < 0x7b) {
      if (bVar1 == 0x5b) {
        if (matcher->num_charset == 0) {
          __s = (stb_uint32 *)malloc_base(matcher,0x400,STB__alloc,stb_alloc_alignment);
          matcher->charset = __s;
          memset(__s,0,0x400);
        }
        memset(local_138,0,0x100);
        bVar1 = *regex;
        pbVar8 = pbVar8 + 2;
        if (bVar1 != 0x5e) {
          pbVar8 = (byte *)regex;
        }
        if (*pbVar8 == 0x5d) {
          local_138[0x5d] = 1;
          pbVar8 = pbVar8 + 1;
        }
        goto LAB_0019299d;
      }
      if (bVar1 == 0x5c) {
        if (*regex == 0) {
          return (char *)0x0;
        }
        goto LAB_00192899;
      }
    }
    else {
      if (bVar1 == 0x7b) {
        return (char *)0x0;
      }
      if (bVar1 == 0x7c) goto switchD_001927e7_caseD_29;
    }
    goto switchD_001927e7_caseD_25;
  }
  switch(bVar1) {
  case 0x24:
    iVar5 = stb__add_node(matcher);
    iVar7 = 10;
    break;
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2c:
  case 0x2d:
    goto switchD_001927e7_caseD_25;
  case 0x28:
    from = (uint)local_14a;
    regex = stb__reg_parse_alt(matcher,from,regex,&local_14a);
    if ((byte *)regex == (byte *)0x0) {
      return (char *)0x0;
    }
    if (*regex != 0x29) {
      return (char *)0x0;
    }
    goto LAB_001928ec;
  case 0x29:
    goto switchD_001927e7_caseD_29;
  case 0x2a:
    if ((int)from < 0) {
      return (char *)0x0;
    }
    stb__add_epsilon(matcher,from,uVar9 & 0xffff);
  case 0x2b:
    if ((int)from < 0) {
      return (char *)0x0;
    }
    from_00 = uVar9 & 0xffff;
    stb__add_epsilon(matcher,from_00,from);
    uVar9 = stb__add_node(matcher);
    stb__add_epsilon(matcher,from_00,uVar9);
    local_14a = (ushort)uVar9;
    pbVar8 = (byte *)regex;
    goto LAB_001927c8;
  case 0x2e:
    iVar5 = stb__add_node(matcher);
    iVar7 = -1;
    break;
  default:
    if (bVar1 == 0) {
switchD_001927e7_caseD_29:
      *local_140 = local_14a;
      return (char *)pbVar8;
    }
    goto switchD_001927e7_caseD_25;
  }
  from = (uint)local_14a;
  stb__add_edge(matcher,from,iVar5,iVar7);
  local_14a = (ushort)iVar5;
  goto LAB_001927c2;
LAB_0019299d:
  bVar2 = *pbVar8;
  uVar9 = (uint)(char)bVar2;
  if (uVar9 != 0x5d) {
    if (bVar2 == 0) {
LAB_001929d3:
      bVar4 = false;
    }
    else {
      if (pbVar8[1] == 0x2d) {
        bVar3 = pbVar8[2];
        if ((int)(char)bVar3 == 0x5d) goto LAB_001929bb;
        pbVar8 = pbVar8 + 3;
        if (bVar3 < bVar2) goto LAB_001929d3;
        do {
          local_138[uVar9] = 1;
          uVar9 = uVar9 + 1;
        } while (uVar9 <= (uint)(int)(char)bVar3);
      }
      else {
LAB_001929bb:
        pbVar8 = pbVar8 + 1;
        local_138[uVar9] = 1;
      }
      bVar4 = true;
    }
    if (!bVar4) goto LAB_00192ad6;
    goto LAB_0019299d;
  }
  if (bVar1 == 0x5e) {
    lVar6 = 0;
    do {
      local_138[lVar6] = 1 - local_138[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  iVar5 = matcher->num_charset;
  if (iVar5 < 1) {
    iVar7 = 0;
  }
  else {
    iVar10 = 0;
    do {
      local_148[1] = 1 << ((byte)iVar10 & 0x1f);
      local_148[0] = 0;
      lVar6 = 0;
      do {
        if ((matcher->charset[lVar6] & local_148[1]) != local_148[local_138[lVar6]])
        goto LAB_00192a56;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x100);
      lVar6 = 0x100;
LAB_00192a56:
      iVar7 = iVar10;
    } while (((int)lVar6 != 0x100) && (iVar10 = iVar10 + 1, iVar7 = iVar5, iVar10 != iVar5));
  }
  if (iVar7 == iVar5) {
    matcher->num_charset = iVar5 + 1;
    if (0x1f < iVar5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x2429,"char *stb__reg_parse(stb_matcher *, int, char *, stb_uint16 *)");
    }
    lVar6 = 0;
    do {
      if (local_138[lVar6] != 0) {
        matcher->charset[lVar6] = matcher->charset[lVar6] | 1 << ((byte)iVar7 & 0x1f);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  pbVar8 = pbVar8 + 1;
  iVar5 = stb__add_node(matcher);
  from = (uint)local_14a;
  stb__add_edge(matcher,from,iVar5,-2 - iVar7);
  local_14a = (ushort)iVar5;
LAB_00192ad6:
  regex = (char *)pbVar8;
  if (bVar2 != 0x5d) {
    return (char *)0x0;
  }
  goto LAB_001927c2;
code_r0x00192842:
  if ((int)from < 0) {
    return (char *)0x0;
  }
  stb__add_epsilon(matcher,from,uVar9 & 0xffff);
  pbVar8 = (byte *)regex;
  goto LAB_001927c8;
switchD_001927e7_caseD_25:
  regex = (char *)pbVar8;
LAB_00192899:
  iVar5 = stb__add_node(matcher);
  from = (uint)local_14a;
  stb__add_edge(matcher,from,iVar5,(int)*regex);
  local_14a = (ushort)iVar5;
LAB_001928ec:
  regex = (char *)((byte *)regex + 1);
  goto LAB_001927c2;
}

Assistant:

static char *stb__reg_parse(stb_matcher *matcher, int start, char *regex, stb_uint16 *end)
{
   int n;
   int last_start = -1;
   stb_uint16 last_end = start;

   while (*regex) {
      switch (*regex) {
         case '(':
            last_start = last_end;
            regex = stb__reg_parse_alt(matcher, last_end, regex+1, &last_end);
            if (regex == NULL || *regex != ')')
               return NULL;
            ++regex;
            break;

         case '|':
         case ')':
            *end = last_end;
            return regex;

         case '?':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_start, last_end);
            ++regex;
            break;

         case '*':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_start, last_end);

            // fall through

         case '+':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_end, last_start);
            // prevent links back to last_end from chaining to last_start
            n = stb__add_node(matcher);
            stb__add_epsilon(matcher, last_end, n);
            last_end = n;
            ++regex;
            break;

         case '{':   // not supported!
            // @TODO: given {n,m}, clone last_start to last_end m times,
            // and include epsilons from start to first m-n blocks
            return NULL; 

         case '\\':
            ++regex;
            if (!*regex) return NULL;

            // fallthrough
         default: // match exactly this character
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, *regex);
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '$':
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, '\n');
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '.':
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, -1);
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '[': {
            stb_uint8 flags[256];
            int invert = 0,z;
            ++regex;
            if (matcher->num_charset == 0) {
               matcher->charset = (stb_uint *) stb_malloc(matcher, sizeof(*matcher->charset) * 256);
               memset(matcher->charset, 0, sizeof(*matcher->charset) * 256);
            }

            memset(flags,0,sizeof(flags));

            // leading ^ is special
            if (*regex == '^')
               ++regex, invert = 1;

            // leading ] is special
            if (*regex == ']') {
               flags[']'] = 1;
               ++regex;
            }
            while (*regex != ']') {
               stb_uint a;
               if (!*regex) return NULL;
               a = *regex++;
               if (regex[0] == '-' && regex[1] != ']') {
                  stb_uint i,b = regex[1];
                  regex += 2;
                  if (b == 0) return NULL;
                  if (a > b) return NULL;
                  for (i=a; i <= b; ++i)
                     flags[i] = 1;
               } else
                  flags[a] = 1;
            }
            ++regex;
            if (invert) {
               int i;
               for (i=0; i < 256; ++i)
                  flags[i] = 1-flags[i];
            }

            // now check if any existing charset matches
            for (z=0; z < matcher->num_charset; ++z) {
               int i, k[2] = { 0, 1 << z};
               for (i=0; i < 256; ++i) {
                  unsigned int f = k[flags[i]];
                  if ((matcher->charset[i] & k[1]) != f)
                     break;
               }
               if (i == 256) break;
            }

            if (z == matcher->num_charset) {
               int i;
               ++matcher->num_charset;
               if (matcher->num_charset > 32) {
                  assert(0); /* NOTREACHED */
                  return NULL; // too many charsets, oops
               }
               for (i=0; i < 256; ++i)
                  if (flags[i])
                     matcher->charset[i] |= (1 << z);
            }

            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, -2 - z);
            last_start = last_end;
            last_end = n;
            break;
         }
      }
   }
   *end = last_end;
   return regex;
}